

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O0

void __thiscall EntryKey::dump(EntryKey *this)

{
  bool bVar1;
  uint32_t uVar2;
  ostream *poVar3;
  void *pvVar4;
  char *pcVar5;
  EntryKey *in_RDI;
  
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,std::hex);
  poVar3 = std::operator<<(poVar3,"Flags: 0x");
  uVar2 = flags(in_RDI);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,uVar2);
  poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"Name index: 0x");
  uVar2 = nameIndex(in_RDI);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,uVar2);
  poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"Ext index: 0x");
  uVar2 = extIndex(in_RDI);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,uVar2);
  poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"Link index: 0x");
  uVar2 = linkIndex(in_RDI);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,uVar2);
  poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"Is directory: ");
  bVar1 = isDirectory(in_RDI);
  pcVar5 = "false";
  if (bVar1) {
    pcVar5 = "true";
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"Is file: ");
  bVar1 = isFile(in_RDI);
  pcVar5 = "false";
  if (bVar1) {
    pcVar5 = "true";
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::dec);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void EntryKey::dump() const
{
	std::cout
		<< std::hex
		<< "Flags: 0x" << flags() << std::endl
		<< "Name index: 0x" << nameIndex() << std::endl
		<< "Ext index: 0x" << extIndex() << std::endl
		<< "Link index: 0x" << linkIndex() << std::endl
		<< "Is directory: " << (isDirectory() ? "true" : "false") << std::endl
		<< "Is file: " << (isFile() ? "true" : "false") << std::endl
		<< std::dec << std::endl;
}